

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O2

double __thiscall TasGrid::RuleWavelet::eval_linear<1>(RuleWavelet *this,int point,double x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = Maths::intlog2(point + -1);
  iVar3 = 1 << ((byte)iVar1 & 0x1f);
  iVar2 = (point + -1) % iVar3;
  dVar4 = ldexp(1.0,iVar1 + -2);
  if (iVar2 == 0) {
    dVar5 = linear_boundary_wavelet<1>(this,(x + 1.0) * dVar4 + -1.0,x <= 0.0);
  }
  else if (iVar2 == iVar3 + -1) {
    dVar5 = linear_boundary_wavelet<1>(this,(1.0 - x) * dVar4 + -1.0,0.0 < x);
  }
  else {
    dVar5 = linear_central_wavelet<1>
                      (this,(x + 1.0) * dVar4 + -1.0 + (double)(iVar2 + -1) * -0.5,x <= 0.0);
  }
  if (iVar2 == iVar3 + -1) {
    dVar4 = -dVar4;
  }
  return dVar4 * dVar5;
}

Assistant:

inline double RuleWavelet::eval_linear(int point, double x) const{
    // Given a wavelet designated by point and a value x, evaluates the wavelet (or its derivative) at x.
    // If x <= 0 (resp. x > 0), we take only right (resp. left) derivatives.

    // Standard Lifted Wavelets
    int l = Maths::intlog2(point - 1);
    int subindex = (point - 1) % (1 << l);
    double scale = std::pow(2,l-2);

    double value;
    if (subindex == 0){
        // Left boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (x + 1.) - 1., x <= 0.0);
    } else if (subindex == (1 << l) - 1) {
        // Right boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (1. - x) - 1., x > 0.0);
    } else {
        // Central wavelets
        double shift = 0.5 * (double (subindex - 1));
        value = linear_central_wavelet<mode>(scale * (x + 1) - 1. - shift, x <= 0.0);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= (subindex == (1 << l) - 1) ? -scale : scale;

    return value;
}